

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O3

void __thiscall
pbrt::MIPMap::MIPMap
          (MIPMap *this,Image *image,RGBColorSpace *colorSpace,WrapMode wrapMode,Allocator alloc,
          MIPMapFilterOptions *options)

{
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  memory_resource *pmVar7;
  Image *pIVar8;
  WrapMode2D wrapMode_00;
  ulong uVar9;
  ulong uVar10;
  Image **ppIVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> vStack_168;
  Image local_148;
  
  pmVar7 = pstd::pmr::new_delete_resource();
  (this->pyramid).alloc.memoryResource = pmVar7;
  (this->pyramid).nStored = 0;
  (this->pyramid).ptr = (Image *)0x0;
  (this->pyramid).nAlloc = 0;
  this->colorSpace = colorSpace;
  this->wrapMode = wrapMode;
  this->options = *options;
  if (colorSpace == (RGBColorSpace *)0x0) {
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
               ,0xc5,"Check failed: %s",(char (*) [22])"colorSpace != nullptr");
  }
  local_148.format = image->format;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (image->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (image->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&local_148.channelNames,&image->channelNames);
  local_148.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(image->encoding).
           super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
           .bits;
  local_148.p8.alloc.memoryResource = (image->p8).alloc.memoryResource;
  local_148.p8.nAlloc = (image->p8).nAlloc;
  local_148.p8.nStored = (image->p8).nStored;
  local_148.p8.ptr = (image->p8).ptr;
  (image->p8).nStored = 0;
  (image->p8).ptr = (uchar *)0x0;
  (image->p8).nAlloc = 0;
  local_148.p16.alloc.memoryResource = (image->p16).alloc.memoryResource;
  local_148.p16.nAlloc = (image->p16).nAlloc;
  local_148.p16.nStored = (image->p16).nStored;
  local_148.p16.ptr = (image->p16).ptr;
  (image->p16).nStored = 0;
  (image->p16).ptr = (Half *)0x0;
  (image->p16).nAlloc = 0;
  local_148.p32.alloc.memoryResource = (image->p32).alloc.memoryResource;
  local_148.p32.nAlloc = (image->p32).nAlloc;
  local_148.p32.nStored = (image->p32).nStored;
  local_148.p32.ptr = (image->p32).ptr;
  (image->p32).nStored = 0;
  (image->p32).ptr = (float *)0x0;
  (image->p32).nAlloc = 0;
  wrapMode_00.wrap.values[1] = wrapMode;
  wrapMode_00.wrap.values[0] = wrapMode;
  Image::GenerateMIPMap(&vStack_168,&local_148,wrapMode_00,alloc);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator=
            (&this->pyramid,&vStack_168);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::~vector(&vStack_168);
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  sVar1 = (this->pyramid).nStored;
  if (sVar1 != 0) {
    ppIVar11 = &(this->pyramid).ptr;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_005060a0);
    vpmovsxwd_avx2(_DAT_005060b0);
    vpmovsxwd_avx2(_DAT_005060c0);
    pIVar8 = *ppIVar11;
    auVar19 = ZEXT864(*(ulong *)(in_FS_OFFSET + -0x490));
    auVar14 = vpbroadcastq_avx512f();
    auVar14 = vpsrlq_avx512f(auVar14,8);
    uVar9 = 0;
    do {
      auVar15 = vpbroadcastq_avx512f();
      auVar16 = vmovdqa64_avx512f(auVar19);
      uVar10 = uVar9 + 8;
      auVar19 = vporq_avx512f(auVar15,auVar13);
      uVar6 = vpcmpuq_avx512f(auVar19,auVar14,2);
      auVar19 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pIVar8->p16).alloc.memoryResource + uVar9));
      bVar2 = (byte)uVar6;
      auVar15._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar19._8_8_;
      auVar15._0_8_ = (ulong)(bVar2 & 1) * auVar19._0_8_;
      auVar15._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar19._16_8_;
      auVar15._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar19._24_8_;
      auVar15._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar19._32_8_;
      auVar15._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar19._40_8_;
      auVar15._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar19._48_8_;
      auVar15._56_8_ = (uVar6 >> 7) * auVar19._56_8_;
      auVar19 = vpgatherdq_avx512f(*(undefined4 *)((long)ppIVar11 + (long)pIVar8));
      auVar18._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar19._8_8_;
      auVar18._0_8_ = (ulong)(bVar2 & 1) * auVar19._0_8_;
      auVar18._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar19._16_8_;
      auVar18._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar19._24_8_;
      auVar18._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar19._32_8_;
      auVar18._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar19._40_8_;
      auVar18._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar19._48_8_;
      auVar18._56_8_ = (uVar6 >> 7) * auVar19._56_8_;
      auVar19 = vpgatherdq_avx512f(*(undefined4 *)((long)&pIVar8->format + (ulong)wrapMode));
      auVar17._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar19._8_8_;
      auVar17._0_8_ = (ulong)(bVar2 & 1) * auVar19._0_8_;
      auVar17._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar19._16_8_;
      auVar17._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar19._24_8_;
      auVar17._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar19._32_8_;
      auVar17._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar19._40_8_;
      auVar17._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar19._48_8_;
      auVar17._56_8_ = (uVar6 >> 7) * auVar19._56_8_;
      pIVar8 = pIVar8 + 8;
      auVar19 = vpaddq_avx512f(auVar15,auVar16);
      auVar15 = vpaddq_avx512f(auVar18,auVar18);
      auVar18 = vpsllq_avx512f(auVar17,2);
      auVar19 = vpaddq_avx512f(auVar19,auVar15);
      auVar19 = vpaddq_avx512f(auVar19,auVar18);
      uVar9 = uVar10;
    } while (((sVar1 * 0x118 - 0x118) / 0x118 + 8 & 0xfffffffffffffff8) != uVar10);
    auVar13 = vmovdqa64_avx512f(auVar19);
    auVar14._0_8_ = (ulong)(bVar2 & 1) * auVar13._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar16._0_8_;
    bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar14._8_8_ = (ulong)bVar3 * auVar13._8_8_ | (ulong)!bVar3 * auVar16._8_8_;
    bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar14._16_8_ = (ulong)bVar3 * auVar13._16_8_ | (ulong)!bVar3 * auVar16._16_8_;
    bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar14._24_8_ = (ulong)bVar3 * auVar13._24_8_ | (ulong)!bVar3 * auVar16._24_8_;
    bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar14._32_8_ = (ulong)bVar3 * auVar13._32_8_ | (ulong)!bVar3 * auVar16._32_8_;
    bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar14._40_8_ = (ulong)bVar3 * auVar13._40_8_ | (ulong)!bVar3 * auVar16._40_8_;
    bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar14._48_8_ = (ulong)bVar3 * auVar13._48_8_ | (ulong)!bVar3 * auVar16._48_8_;
    auVar14._56_8_ = (uVar6 >> 7) * auVar13._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar16._56_8_;
    auVar12 = vextracti64x4_avx512f(auVar14,1);
    auVar13 = vpaddq_avx512f(auVar14,ZEXT3264(auVar12));
    auVar4 = vpaddq_avx(auVar13._0_16_,auVar13._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpaddq_avx(auVar4,auVar5);
    *(long *)(in_FS_OFFSET + -0x490) = auVar4._0_8_;
  }
  return;
}

Assistant:

MIPMap::MIPMap(Image image, const RGBColorSpace *colorSpace, WrapMode wrapMode,
               Allocator alloc, const MIPMapFilterOptions &options)
    : colorSpace(colorSpace), wrapMode(wrapMode), options(options) {
    CHECK(colorSpace != nullptr);
    pyramid = Image::GenerateMIPMap(std::move(image), wrapMode, alloc);
    std::for_each(pyramid.begin(), pyramid.end(),
                  [](const Image &im) { imageMapBytes += im.BytesUsed(); });
}